

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

RequestConnectOrProtocolError * __thiscall
kj::HttpHeaders::tryParseRequestOrConnect
          (RequestConnectOrProtocolError *__return_storage_ptr__,HttpHeaders *this,
          ArrayPtr<char> content)

{
  long lVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  undefined4 uVar5;
  bool bVar6;
  ulong uVar7;
  int extraout_EDX;
  char *pcVar8;
  undefined4 unaff_R12D;
  char *end;
  char *ptr;
  RequestConnectOrProtocolError result;
  OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
  local_110;
  char *local_d0;
  int local_c4;
  Fault local_c0;
  OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
  local_b8;
  Fault local_78;
  undefined8 uStack_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined3 uStack_54;
  HttpHeaders *local_50;
  undefined8 local_40;
  undefined8 uStack_38;
  
  uVar7 = content.size_;
  pcVar8 = content.ptr;
  if ((uVar7 < 2) || (pcVar8[uVar7 - 1] != '\n')) {
    end = (char *)0x0;
  }
  else {
    lVar1 = uVar7 - 1;
    if (pcVar8[uVar7 - 2] == '\r') {
      lVar1 = uVar7 - 2;
    }
    end = pcVar8 + lVar1;
    pcVar8[~(ulong)(pcVar8[uVar7 - 2] == '\r') + uVar7] = '\0';
  }
  if (end == (char *)0x0) {
    __return_storage_ptr__->tag = 3;
    *(undefined4 *)&__return_storage_ptr__->field_1 = 400;
    *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Request";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
         "Request headers have no terminal newline.";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x2a;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x28) = pcVar8;
    *(ulong *)((long)&__return_storage_ptr__->field_1 + 0x30) = uVar7;
    return __return_storage_ptr__;
  }
  local_b8.tag = 0;
  local_d0 = pcVar8;
  local_50 = this;
  consumeHttpMethod((Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)&local_110,&local_d0
                   );
  uVar3 = local_110.field_1._0_4_;
  local_c4 = extraout_EDX;
  if ((char)local_110.tag == '\x01') {
    if (local_110.field_1._0_4_ == 1) {
      local_110.field_1._0_4_ = 0;
    }
    local_c4 = local_110.field_1._8_4_;
    unaff_R12D = uVar3;
    if (local_110.field_1._0_4_ == 2) {
      local_110.field_1._0_4_ = 0;
    }
  }
  if (((char)local_110.tag == '\0') || ((*local_d0 != '\t' && (*local_d0 != ' ')))) {
    __return_storage_ptr__->tag = 3;
    *(undefined4 *)&__return_storage_ptr__->field_1 = 0x1f5;
    *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Not Implemented";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0x10;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) = "Unrecognized request method.";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x1d;
    goto LAB_0039e065;
  }
  local_d0 = local_d0 + 1;
  consumeWord(&local_d0);
  if ((char)local_110.tag == '\x01') {
    local_40 = CONCAT44(local_110.field_1._4_4_,local_110.field_1._0_4_);
    uStack_38 = CONCAT44(local_110.field_1._12_4_,local_110.field_1._8_4_);
    uStack_64._3_1_ = (undefined1)local_110.field_1._0_4_;
    uStack_60 = (undefined4)((ulong)local_40 >> 8);
    uStack_5c._3_1_ = (undefined1)local_110.field_1._8_4_;
    uStack_5c = CONCAT13(uStack_5c._3_1_,(int3)((uint)local_110.field_1._4_4_ >> 8));
    uStack_58 = (undefined4)((ulong)uStack_38 >> 8);
    uStack_54 = (undefined3)((uint)local_110.field_1._12_4_ >> 8);
  }
  else {
    __return_storage_ptr__->tag = 3;
    *(undefined4 *)&__return_storage_ptr__->field_1 = 400;
    *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Request";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) = "Invalid request line.";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x16;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x28) = pcVar8;
    *(ulong *)((long)&__return_storage_ptr__->field_1 + 0x30) = uVar7;
  }
  uVar5 = uStack_58;
  iVar4 = uStack_5c;
  uVar3 = uStack_60;
  iVar2 = uStack_64;
  if ((char)local_110.tag == '\0') {
    return __return_storage_ptr__;
  }
  uStack_64 = (int)local_40;
  uStack_60 = (undefined4)((ulong)local_40 >> 0x20);
  uStack_5c = (int)uStack_38;
  uStack_58 = (undefined4)((ulong)uStack_38 >> 0x20);
  if (unaff_R12D == 2) {
    if ((char)local_110.tag == '\0') {
      local_78.exception = (Exception *)0x0;
      uStack_68 = 0;
      uStack_64 = 0;
      uStack_60 = 0;
      uStack_5c = 0;
      uStack_58 = uVar5;
      kj::_::Debug::Fault::init
                (&local_78,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                );
      kj::_::Debug::Fault::fatal(&local_78);
    }
    local_110.tag = 2;
    local_110.field_1._0_4_ = uStack_64;
    local_110.field_1._4_4_ = uStack_60;
    local_110.field_1._8_4_ = uStack_5c;
    local_110.field_1._12_4_ = uStack_58;
    uStack_64 = iVar2;
    uStack_60 = uVar3;
    uStack_5c = iVar4;
    uStack_58 = uVar5;
    OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
    ::operator=(&local_b8,&local_110);
LAB_0039e1b4:
    if (local_110.tag == 1) {
      local_110.tag = 0;
    }
    if (local_110.tag == 2) {
      local_110.tag = 0;
    }
    iVar2 = uStack_64;
    uVar3 = uStack_60;
    iVar4 = uStack_5c;
    uVar5 = uStack_58;
    if (local_110.tag == 3) {
      local_110.tag = 0;
    }
  }
  else if (unaff_R12D == 1) {
    if ((char)local_110.tag == '\0') {
      local_c0.exception = (Exception *)0x0;
      local_78.exception = (Exception *)0x0;
      uStack_70 = 0;
      uStack_64 = iVar2;
      uStack_60 = uVar3;
      uStack_5c = iVar4;
      uStack_58 = uVar5;
      kj::_::Debug::Fault::init
                (&local_c0,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                );
      kj::_::Debug::Fault::fatal(&local_c0);
    }
    local_110.tag = 1;
    local_110.field_1._0_4_ = local_c4;
    local_110.field_1._4_4_ = uStack_68;
    local_110.field_1._8_4_ = uStack_64;
    local_110.field_1._12_4_ = uStack_60;
    local_110.field_1._16_4_ = uStack_5c;
    local_110.field_1._20_4_ = uStack_58;
    OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
    ::operator=(&local_b8,&local_110);
    goto LAB_0039e1b4;
  }
  uStack_58 = uVar5;
  uStack_5c = iVar4;
  uStack_60 = uVar3;
  uStack_64 = iVar2;
  consumeLine(&local_d0);
  bVar6 = parseHeaders(local_50,local_d0,end);
  if (bVar6) {
    __return_storage_ptr__->tag = local_b8.tag;
    if (local_b8.tag == 3) {
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_b8.field_1._48_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = local_b8.field_1._32_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_b8.field_1._40_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = local_b8.field_1._16_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x18) = local_b8.field_1._24_8_;
    }
    else if (local_b8.tag != 2) {
      if (local_b8.tag != 1) {
        return __return_storage_ptr__;
      }
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = local_b8.field_1._16_8_;
    }
    *(undefined4 *)&__return_storage_ptr__->field_1 = local_b8.field_1._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 4) = local_b8.field_1._4_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = local_b8.field_1._8_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0xc) = local_b8.field_1._12_4_;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->tag = 3;
  *(undefined4 *)&__return_storage_ptr__->field_1 = 400;
  *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Request";
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
  *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
       "The headers sent by your client are not valid.";
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x2f;
LAB_0039e065:
  *(char **)((long)&__return_storage_ptr__->field_1 + 0x28) = pcVar8;
  *(ulong *)((long)&__return_storage_ptr__->field_1 + 0x30) = uVar7;
  return __return_storage_ptr__;
}

Assistant:

HttpHeaders::RequestConnectOrProtocolError HttpHeaders::tryParseRequestOrConnect(
    kj::ArrayPtr<char> content) {
  char* end = trimHeaderEnding(content);
  if (end == nullptr) {
    return ProtocolError { 400, "Bad Request",
        "Request headers have no terminal newline.", content };
  }

  char* ptr = content.begin();

  HttpHeaders::RequestConnectOrProtocolError result;

  KJ_IF_SOME(method, consumeHttpMethod(ptr)) {
    if (*ptr != ' ' && *ptr != '\t') {
      return ProtocolError { 501, "Not Implemented",
          "Unrecognized request method.", content };
    }
    ++ptr;

    kj::Maybe<StringPtr> path;
    KJ_IF_SOME(p, consumeWord(ptr)) {
      path = p;
    } else {
      return ProtocolError { 400, "Bad Request",
          "Invalid request line.", content };
    }

    KJ_SWITCH_ONEOF(method) {
      KJ_CASE_ONEOF(m, HttpMethod) {
        result = HttpHeaders::Request { m, KJ_ASSERT_NONNULL(path) };
      }
      KJ_CASE_ONEOF(m, HttpConnectMethod) {
        result = HttpHeaders::ConnectRequest { KJ_ASSERT_NONNULL(path) };
      }
    }
  }